

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O3

void S_RestoreEvictedChannel(FSoundChan *chan)

{
  uint uVar1;
  FSoundChan *pFVar2;
  
  if (chan == (FSoundChan *)0x0) {
    return;
  }
  S_RestoreEvictedChannel(chan->NextChan);
  if ((chan->ChanFlags & 2U) == 0) {
    if ((chan->ChanFlags & 0x104U) != 4) {
      return;
    }
    if ((chan->super_FISoundChannel).SysChannel != (void *)0x0) {
      return;
    }
  }
  else {
    S_RestartSound(chan);
    uVar1 = chan->ChanFlags;
    if ((uVar1 >> 8 & 1) != 0) {
      return;
    }
    if ((uVar1 & 2) == 0) {
      if ((uVar1 >> 9 & 1) != 0) {
        return;
      }
      chan->ChanFlags = uVar1 | 4;
      return;
    }
  }
  pFVar2 = chan->NextChan;
  *chan->PrevChan = pFVar2;
  if (pFVar2 != (FSoundChan *)0x0) {
    pFVar2->PrevChan = chan->PrevChan;
  }
  *(undefined8 *)&chan->LimitRange = 0;
  (chan->field_12).Actor = (AActor *)0x0;
  chan->Volume = 0.0;
  chan->ChanFlags = 0;
  chan->Pitch = 0;
  chan->EntChannel = '\0';
  chan->Priority = '\0';
  chan->NearLimit = 0;
  chan->SourceType = '\0';
  chan->field_0x4f = 0;
  chan->PrevChan = (FSoundChan **)0x0;
  chan->SoundID = 0;
  chan->OrgID = 0;
  (chan->super_FISoundChannel).DistanceSqr = 0.0;
  (chan->super_FISoundChannel).ManualRolloff = false;
  *(undefined3 *)&(chan->super_FISoundChannel).field_0x25 = 0;
  chan->NextChan = (FSoundChan *)0x0;
  (chan->super_FISoundChannel).Rolloff.RolloffType = 0;
  (chan->super_FISoundChannel).Rolloff.MinDistance = 0.0;
  *(undefined8 *)&(chan->super_FISoundChannel).Rolloff.field_2 = 0;
  (chan->super_FISoundChannel).SysChannel = (void *)0x0;
  (chan->super_FISoundChannel).StartTime.AsOne = 0;
  *(undefined8 *)((long)&chan->field_12 + 8) = 0;
  chan->NextChan = FreeChannels;
  if (FreeChannels != (FSoundChan *)0x0) {
    FreeChannels->PrevChan = &chan->NextChan;
  }
  FreeChannels = chan;
  chan->PrevChan = &FreeChannels;
  return;
}

Assistant:

void S_RestoreEvictedChannel(FSoundChan *chan)
{
	if (chan == NULL)
	{
		return;
	}
	S_RestoreEvictedChannel(chan->NextChan);
	if (chan->ChanFlags & CHAN_EVICTED)
	{
		S_RestartSound(chan);
		if (!(chan->ChanFlags & CHAN_LOOP))
		{
			if (chan->ChanFlags & CHAN_EVICTED)
			{ // Still evicted and not looping? Forget about it.
				S_ReturnChannel(chan);
			}
			else if (!(chan->ChanFlags & CHAN_JUSTSTARTED))
			{ // Should this sound become evicted again, it's okay to forget about it.
				chan->ChanFlags |= CHAN_FORGETTABLE;
			}
		}
	}
	else if (chan->SysChannel == NULL && (chan->ChanFlags & (CHAN_FORGETTABLE | CHAN_LOOP)) == CHAN_FORGETTABLE)
	{
		S_ReturnChannel(chan);
	}
}